

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O1

BIT_DStream_status BIT_reloadDStream(BIT_DStream_t *bitD)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong *puVar6;
  
  uVar4 = bitD->bitsConsumed;
  uVar5 = (ulong)uVar4;
  if (uVar5 < 0x41) {
    pcVar1 = bitD->ptr;
    if (pcVar1 < bitD->limitPtr) {
      pcVar2 = bitD->start;
      if (pcVar1 == pcVar2) goto LAB_006b894d;
      uVar3 = (int)pcVar1 - (int)pcVar2;
      if (pcVar2 <= pcVar1 + -(ulong)(uVar4 >> 3)) {
        uVar3 = uVar4 >> 3;
      }
      puVar6 = (ulong *)(pcVar1 + -(ulong)uVar3);
      bitD->ptr = (char *)puVar6;
      uVar4 = uVar4 + uVar3 * -8;
    }
    else {
      puVar6 = (ulong *)(pcVar1 + -(ulong)(uVar4 >> 3));
      bitD->ptr = (char *)puVar6;
      uVar4 = uVar4 & 7;
    }
    bitD->bitsConsumed = uVar4;
    uVar5 = *puVar6;
    bitD->bitContainer = uVar5;
  }
LAB_006b894d:
  return (BIT_DStream_status)uVar5;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStream(BIT_DStream_t* bitD)
{
    if (bitD->bitsConsumed > (sizeof(bitD->bitContainer)*8))  /* overflow detected, like end of stream */
        return BIT_DStream_overflow;

    if (bitD->ptr >= bitD->limitPtr) {
        return BIT_reloadDStreamFast(bitD);
    }
    if (bitD->ptr == bitD->start) {
        if (bitD->bitsConsumed < sizeof(bitD->bitContainer)*8) return BIT_DStream_endOfBuffer;
        return BIT_DStream_completed;
    }
    /* start < ptr < limitPtr */
    {   U32 nbBytes = bitD->bitsConsumed >> 3;
        BIT_DStream_status result = BIT_DStream_unfinished;
        if (bitD->ptr - nbBytes < bitD->start) {
            nbBytes = (U32)(bitD->ptr - bitD->start);  /* ptr > start */
            result = BIT_DStream_endOfBuffer;
        }
        bitD->ptr -= nbBytes;
        bitD->bitsConsumed -= nbBytes*8;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);   /* reminder : srcSize > sizeof(bitD->bitContainer), otherwise bitD->ptr == bitD->start */
        return result;
    }
}